

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void lzma_sha256_finish(lzma_check_state *check)

{
  uint uVar1;
  uint64_t uVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  uint8_t uVar5;
  bool bVar6;
  
  uVar5 = 0x80;
  uVar3 = (ulong)((uint)(check->state).sha256.size & 0x3f);
  do {
    while ((check->buffer).u8[uVar3] = uVar5, uVar3 == 0x3f) {
      process(check);
      uVar5 = '\0';
      uVar3 = 0;
    }
    uVar5 = '\0';
    bVar6 = uVar3 != 0x37;
    uVar3 = uVar3 + 1;
  } while (bVar6);
  uVar2 = (check->state).sha256.size;
  uVar3 = uVar2 << 3;
  (check->state).sha256.size = uVar3;
  (check->buffer).u64[7] =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar2 << 0x3b;
  process(check);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)((long)&check->state + lVar4 * 4);
    (check->buffer).u32[lVar4] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return;
}

Assistant:

extern void
lzma_sha256_finish(lzma_check_state *check)
{
	// Add padding as described in RFC 3174 (it describes SHA-1 but
	// the same padding style is used for SHA-256 too).
	size_t pos = check->state.sha256.size & 0x3F;
	check->buffer.u8[pos++] = 0x80;

	while (pos != 64 - 8) {
		if (pos == 64) {
			process(check);
			pos = 0;
		}

		check->buffer.u8[pos++] = 0x00;
	}

	// Convert the message size from bytes to bits.
	check->state.sha256.size *= 8;

	check->buffer.u64[(64 - 8) / 8] = conv64be(check->state.sha256.size);

	process(check);

	for (size_t i = 0; i < 8; ++i)
		check->buffer.u32[i] = conv32be(check->state.sha256.state[i]);

	return;
}